

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void log_log(int level,char *file,int line,char *fmt,...)

{
  FILE *pFVar1;
  char in_AL;
  size_t sVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  time_t t;
  undefined8 local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  tm *local_120;
  FILE *pFStack_118;
  uint local_110;
  int local_10c;
  time_t local_108 [8];
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_148 = 0;
  puStack_140 = (undefined1 *)0x0;
  local_138 = (undefined1 *)0x0;
  local_120 = (tm *)0x0;
  pFStack_118 = (FILE *)0x0;
  local_130 = fmt;
  local_128 = file;
  local_110 = line;
  local_10c = level;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (LOGGING.has_lock) {
    pthread_mutex_lock((pthread_mutex_t *)&LOGGING.lock);
  }
  pFVar1 = _stderr;
  if ((LOGGING.quiet == false) && (LOGGING.level <= level)) {
    local_108[0] = time((time_t *)0x0);
    local_120 = localtime(local_108);
    pFStack_118 = pFVar1;
    local_148 = 0x3000000020;
    puStack_140 = &stack0x00000008;
    local_138 = local_c8;
    sVar2 = strftime(stdout_callback_buf,0x40,"%H:%M:%S",local_120);
    stdout_callback_buf[sVar2] = 0;
    fprintf(pFStack_118,"%s \x1b[1m%s%-5s %s:%d:\x1b[0m ",stdout_callback_buf,
            LOG_LEVEL_COLOR_rel + *(int *)(LOG_LEVEL_COLOR_rel + (long)local_10c * 4),
            LOG_LEVEL_STRING[local_10c],local_128,local_110);
    vfprintf(pFStack_118,local_130,&local_148);
    fputc(10,pFStack_118);
    fflush(pFStack_118);
  }
  if (LOGGING.has_lock == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&LOGGING.lock);
  }
  if (has_init_file == '\x01') {
    if (FILE_LOGGING.has_lock == true) {
      pthread_mutex_lock((pthread_mutex_t *)&FILE_LOGGING.lock);
    }
    if ((FILE_LOGGING.quiet == false) && (FILE_LOGGING.level <= level)) {
      pFStack_118 = (FILE *)FILE_LOGGING.udata;
      sVar2 = strftime((char *)local_108,0x40,"%Y-%m-%d %H:%M:%S",local_120);
      *(undefined1 *)((long)local_108 + sVar2) = 0;
      fprintf(pFStack_118,"%s %-5s %s:%d: ",local_108,LOG_LEVEL_STRING[local_10c],local_128,
              (ulong)local_110);
      vfprintf(pFStack_118,local_130,&local_148);
      fputc(10,pFStack_118);
      fflush(pFStack_118);
    }
    if (FILE_LOGGING.has_lock == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&FILE_LOGGING.lock);
    }
  }
  return;
}

Assistant:

void log_log(int level, const char *file, int line, const char *fmt, ...) {
  log_Event ev = {
      .fmt = fmt,
      .file = file,
      .line = line,
      .level = level,
  };
  lock();
  if (!LOGGING.quiet && level >= LOGGING.level) { //如果非静默 且等级高于阈值
    init_event(&ev, stderr);
    va_start(ev.ap, fmt); //按照格式保存参数到ev.ap
    stdout_callback(&ev); //执行log
    va_end(ev.ap);
  }
  unlock();
  if (has_init_file == 1) {
    lock_file();
    if (!FILE_LOGGING.quiet && level >= FILE_LOGGING.level) {
      ev.udata = FILE_LOGGING.udata;
      file_callback(&ev); //执行log
    }
    unlock_file();
  }
}